

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O3

void __thiscall ImGui::DockNodeUpdate(ImGui *this,ImGuiDockNode *node)

{
  float *pfVar1;
  float fVar2;
  float fVar3;
  float fVar4;
  ImGui IVar5;
  uint uVar6;
  int iVar7;
  uint uVar8;
  uint uVar9;
  ImGuiViewportP *pIVar10;
  ImDrawList *pIVar11;
  ImGuiWindow *pIVar12;
  undefined8 uVar13;
  undefined8 uVar14;
  undefined8 uVar15;
  undefined4 uVar16;
  undefined4 uVar17;
  undefined4 uVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  undefined4 uVar21;
  ImVec2 IVar22;
  ImGuiContext *pIVar23;
  ImGuiContext *pIVar24;
  ImGuiContext *pIVar25;
  bool bVar26;
  bool bVar27;
  ImU32 IVar28;
  ImGuiID IVar29;
  ImGuiWindow *pIVar30;
  ImGui *pIVar31;
  ImVec2 extraout_RAX;
  ImVec2 IVar32;
  ImGuiTabItem *pIVar33;
  int iVar34;
  ulong uVar35;
  char *pcVar36;
  short sVar37;
  int iVar38;
  int iVar39;
  long lVar40;
  ImVec2 *pIVar41;
  ImVec4 *pIVar42;
  char cVar43;
  uint uVar44;
  bool bVar45;
  byte bVar46;
  int iVar47;
  ImGuiID IVar48;
  ImGuiDockNodeTreeInfo *info_00;
  ulong uVar50;
  ImGuiDockNode *pIVar51;
  long lVar52;
  ImGui *pIVar53;
  ushort uVar54;
  float fVar55;
  float fVar56;
  ImRect outer;
  ImRect inner;
  ImRect title_bar_rect;
  bool tab_open;
  ImGuiDockNodeTreeInfo info;
  ImRect tab_bar_rect;
  uint local_178;
  long local_168;
  ImRect local_118;
  undefined8 local_100;
  ImRect *local_f8;
  uint local_ec;
  ImVec2 local_e8;
  undefined8 uStack_e0;
  ImVec4 local_d0;
  ImGui *local_c0;
  ImVec2 local_b8;
  ImVec2 local_b0;
  undefined1 local_a8 [8];
  undefined8 uStack_a0;
  undefined8 local_98;
  ImGuiDockNode *pIStack_90;
  ImGuiDockNode *local_88;
  ImGuiDockNode *pIStack_80;
  ImVector<ImGuiWindow_*> local_78;
  ImGuiTabBar *local_68;
  ImVec2 IStack_60;
  ImVec2 local_58;
  ImVec2 IStack_50;
  ImRect local_48;
  ImGuiWindow *pIVar49;
  
  pIVar23 = GImGui;
  if (*(int *)(this + 0xa8) == GImGui->FrameCount) {
    __assert_fail("node->LastFrameActive != g.FrameCount",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3665,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  *(int *)(this + 0xa4) = GImGui->FrameCount;
  this[0xbe] = (ImGui)((byte)this[0xbe] & 0xf7);
  *(undefined8 *)(this + 0x90) = 0;
  *(undefined8 *)(this + 0x98) = 0;
  if (*(long *)(this + 0x18) == 0) {
    DockNodeUpdateFlagsAndCollapse((ImGuiDockNode *)this);
    info_00 = (ImGuiDockNodeTreeInfo *)local_a8;
    local_98._0_4_ = 0;
    local_98._4_4_ = ImGuiDockNodeState_Unknown;
    local_a8._0_4_ = 0.0;
    local_a8._4_4_ = 0.0;
    uStack_a0 = (ImGuiDockNode *)0x0;
    DockNodeFindInfo((ImGuiDockNode *)this,info_00);
    *(undefined4 *)(this + 0x90) = local_a8._0_4_;
    *(undefined4 *)(this + 0x94) = local_a8._4_4_;
    pIVar51 = (ImGuiDockNode *)0x0;
    if ((ImGuiDockNodeFlags)local_98 == 1) {
      pIVar51 = uStack_a0;
    }
    *(ImGuiDockNode **)(this + 0x98) = pIVar51;
    *(ImGuiDockNodeFlags *)(this + 0xa0) = (ImGuiDockNodeFlags)local_98;
    node = (ImGuiDockNode *)((ulong)info_00 & 0xffffffffffffff00);
    IVar32 = (ImVec2)local_a8;
    if (uStack_a0 == (ImGuiDockNode *)0x0 || *(int *)(this + 0xb0) != 0) {
      if (uStack_a0 != (ImGuiDockNode *)0x0) goto LAB_0013ff49;
    }
    else {
      *(ImGuiID *)(this + 0xb0) = uStack_a0->ID;
LAB_0013ff49:
      if ((uStack_a0->Windows).Size < 1) goto LAB_0014175e;
      pIVar49 = *(uStack_a0->Windows).Data;
      uVar13 = *(undefined8 *)&pIVar49->WindowClass;
      uVar14 = *(undefined8 *)&(pIVar49->WindowClass).ViewportFlagsOverrideSet;
      uVar15 = *(undefined8 *)((long)&(pIVar49->WindowClass).TabItemFlagsOverrideSet + 2);
      *(undefined8 *)(this + 0x6e) =
           *(undefined8 *)((long)&(pIVar49->WindowClass).ViewportFlagsOverrideSet + 2);
      *(undefined8 *)(this + 0x76) = uVar15;
      *(undefined8 *)(this + 100) = uVar13;
      *(undefined8 *)(this + 0x6c) = uVar14;
      lVar40 = (long)(uStack_a0->Windows).Size;
      if (1 < lVar40) {
        node = (ImGuiDockNode *)(this + 100);
        lVar52 = 1;
        do {
          pIVar49 = (uStack_a0->Windows).Data[lVar52];
          if ((pIVar49->WindowClass).DockingAllowUnclassed == false) {
            IVar48 = (pIVar49->WindowClass).ClassId;
            IVar29 = (pIVar49->WindowClass).ParentViewportId;
            uVar13 = *(undefined8 *)&(pIVar49->WindowClass).ViewportFlagsOverrideSet;
            uVar14 = *(undefined8 *)((long)&(pIVar49->WindowClass).TabItemFlagsOverrideSet + 2);
            *(undefined8 *)(this + 0x6e) =
                 *(undefined8 *)((long)&(pIVar49->WindowClass).ViewportFlagsOverrideSet + 2);
            *(undefined8 *)(this + 0x76) = uVar14;
            node->ID = IVar48;
            node->SharedFlags = IVar29;
            *(undefined8 *)(this + 0x6c) = uVar13;
            break;
          }
          lVar52 = lVar52 + 1;
        } while (lVar40 != lVar52);
      }
    }
    for (; IVar32 != (ImVec2)0x0; IVar32 = *(ImVec2 *)((long)IVar32 + 0x18)) {
      *(byte *)((long)IVar32 + 0xbd) = *(byte *)((long)IVar32 + 0xbd) | 0x20;
    }
  }
  if ((*(ImGuiTabBar **)(this + 0x40) != (ImGuiTabBar *)0x0) && (((byte)this[0x11] & 0x10) != 0)) {
    IM_DELETE<ImGuiTabBar>(*(ImGuiTabBar **)(this + 0x40));
    *(undefined8 *)(this + 0x40) = 0;
  }
  uVar6 = *(uint *)(this + 0x10);
  if ((uVar6 >> 10 & 1) == 0 && *(long *)(this + 0x18) == 0) {
    iVar47 = *(int *)(this + 0x30);
    if (((iVar47 < 2) && (*(long *)(this + 0x20) == 0)) &&
       ((pIVar23->IO).ConfigDockingAlwaysTabBar == false)) {
      if (iVar47 == 0) goto LAB_00140294;
      if (iVar47 != 1) {
LAB_0014175e:
        pcVar36 = "T &ImVector<ImGuiWindow *>::operator[](int) [T = ImGuiWindow *]";
LAB_00141773:
        __assert_fail("i >= 0 && i < Size",
                      "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                      ,0x706,pcVar36);
      }
      pIVar49 = (ImGuiWindow *)**(long **)(this + 0x38);
      if (((pIVar49->WindowClass).DockingAlwaysTabBar == false) || (*(int *)(this + 0xa0) == 0))
      goto LAB_0014012c;
    }
    else if (*(int *)(this + 0xa0) == 0) {
      if (iVar47 != 1) goto LAB_00140294;
      pIVar49 = (ImGuiWindow *)**(undefined8 **)(this + 0x38);
LAB_0014012c:
      *(ImVec2 *)(this + 0x48) = pIVar49->Pos;
      *(ImVec2 *)(this + 0x50) = pIVar49->SizeFull;
      *(ushort *)(this + 0xbc) = (ushort)*(undefined4 *)(this + 0xbc) & 0xfe00 | 0x92;
      pIVar30 = *(ImGuiWindow **)(this + 0x80);
      if (pIVar30 != (ImGuiWindow *)0x0) {
        if (pIVar23->NavWindow == pIVar30) {
          FocusWindow(pIVar49);
          pIVar30 = *(ImGuiWindow **)(this + 0x80);
          if (pIVar30 == (ImGuiWindow *)0x0) goto LAB_00140294;
        }
        pIVar10 = pIVar30->Viewport;
        pIVar49->Viewport = pIVar10;
        pIVar49->ViewportId = pIVar30->ViewportId;
        if (pIVar30->ViewportOwned == true) {
          pIVar10->Window = pIVar49;
          pIVar49->ViewportOwned = true;
        }
      }
LAB_00140294:
      DockNodeHideHostWindow((ImGuiDockNode *)this);
      *(undefined4 *)(this + 0x14) = 1;
      *(undefined4 *)(this + 0xb8) = 0;
      this[0xbd] = (ImGui)((byte)this[0xbd] & 0xa7);
      *(int *)(this + 0xa8) = pIVar23->FrameCount;
      if (((byte)this[0xbe] & 1) == 0) {
        return;
      }
      if (*(int *)(this + 0x30) != 1) {
        return;
      }
      DockNodeStartMouseMovingWindow
                ((ImGuiDockNode *)this,(ImGuiWindow *)**(undefined8 **)(this + 0x38));
      return;
    }
  }
  if ((((*(uint *)(this + 0xbc) >> 9 & 1) != 0) &&
      (((uVar6 >> 10 & 1) == 0 && *(long *)(this + 0x18) == 0) && *(long *)(this + 0x80) == 0)) &&
     (*(long *)(this + 0x20) == 0)) {
    if ((int)*(uint *)(this + 0x30) < 1) {
      __assert_fail("node->Windows.Size > 0",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ac,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    node = *(ImGuiDockNode **)(this + 0x38);
    if (*(int *)(this + 0xb4) != 0) {
      uVar35 = 0;
      do {
        pIVar51 = node->ChildNodes[uVar35 - 4];
        if (pIVar51->LocalFlags == *(int *)(this + 0xb4)) goto LAB_00140206;
        uVar35 = uVar35 + 1;
      } while (*(uint *)(this + 0x30) != uVar35);
    }
    pIVar51 = *(ImGuiDockNode **)node;
LAB_00140206:
    if (('\0' < *(char *)pIVar51[1].ChildNodes) ||
       ('\0' < *(char *)((long)pIVar51[1].ChildNodes + 1))) {
      *(undefined4 *)(this + 0x14) = 2;
      return;
    }
  }
  uVar44 = *(uint *)(this + 0x30);
  uVar35 = (ulong)uVar44;
  bVar45 = (uVar6 >> 0xe & 1) == 0 && 0 < (int)uVar44;
  pIVar49 = (ImGuiWindow *)CONCAT71((int7)((ulong)node >> 8),bVar45);
  *(ushort *)(this + 0xbc) = (ushort)*(uint *)(this + 0xbc) & 0xe7ff | (ushort)bVar45 << 0xc;
  if ((int)uVar44 < 1) {
    bVar45 = false;
  }
  else {
    lVar40 = 0;
    do {
      lVar52 = *(long *)(*(long *)(this + 0x38) + lVar40 * 8);
      iVar47 = *(int *)(lVar52 + 0xd0) << 0xb;
      *(ushort *)(this + 0xbc) = *(ushort *)(this + 0xbc) | (ushort)iVar47;
      uVar50 = (ulong)CONCAT31((int3)((uint)iVar47 >> 8),*(undefined1 *)(lVar52 + 0x3e1)) &
               0xfffffffffffffffe;
      bVar46 = (byte)uVar50 | 1 < (int)uVar35;
      pIVar49 = (ImGuiWindow *)CONCAT71((int7)(uVar50 >> 8),bVar46);
      *(byte *)(lVar52 + 0x3e1) = bVar46;
      lVar40 = lVar40 + 1;
      uVar35 = (ulong)*(int *)(this + 0x30);
    } while (lVar40 < (long)uVar35);
    bVar45 = 0 < *(int *)(this + 0x30);
  }
  if ((short)uVar6 < 0) {
    this[0xbd] = (ImGui)((byte)this[0xbd] & 0xf7);
  }
  pIVar24 = GImGui;
  if (((byte)this[0x11] & 4) == 0) {
    if (*(long *)(this + 0x18) == 0) {
      uVar44 = *(uint *)(this + 0xbc);
      if ((uVar44 >> 9 & 1) == 0) {
        local_100 = 0;
        pIVar30 = (ImGuiWindow *)0x0;
      }
      else {
        if (bVar45) {
          pIVar31 = (ImGui *)**(long **)(this + 0x38);
          bVar45 = pIVar31 != (ImGui *)0x0;
          pIVar53 = pIVar31;
          bVar26 = true;
          if ((uVar44 & 7) != 2 || !bVar45) goto LAB_00140303;
LAB_00140313:
          bVar45 = bVar26;
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar24->NextWindowData).PosVal = *(ImVec2 *)(pIVar53 + 0x48);
          (pIVar24->NextWindowData).PosPivotVal.x = 0.0;
          (pIVar24->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar24->NextWindowData).PosCond = 1;
          (pIVar24->NextWindowData).PosUndock = true;
        }
        else {
          bVar45 = false;
          pIVar31 = (ImGui *)0x0;
LAB_00140303:
          pIVar53 = this;
          bVar26 = bVar45;
          if ((uVar44 & 7) == 1) goto LAB_00140313;
        }
        pIVar24 = GImGui;
        sVar37 = (short)((uint)(int)(short)(*(int *)(this + 0xbc) << 10) >> 0xd);
        if ((sVar37 == 2) && (bVar45)) {
          pIVar41 = (ImVec2 *)(pIVar31 + 0x58);
LAB_00140373:
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 2;
          (pIVar24->NextWindowData).SizeVal = *pIVar41;
          (pIVar24->NextWindowData).SizeCond = 1;
        }
        else if (sVar37 == 1) {
          pIVar41 = (ImVec2 *)(this + 0x50);
          goto LAB_00140373;
        }
        pIVar24 = GImGui;
        uVar54 = *(ushort *)(this + 0xbc);
        if ((bool)((uVar54 & 0x38) == 0x10 & bVar45)) {
          IVar5 = pIVar31[0xca];
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 8;
          (pIVar24->NextWindowData).CollapsedVal = (bool)IVar5;
          (pIVar24->NextWindowData).CollapsedCond = 1;
          uVar54 = *(ushort *)(this + 0xbc);
        }
        pIVar24 = GImGui;
        if ((bool)((uVar54 & 0x1c0) == 0x80 & bVar45)) {
          IVar48 = *(ImGuiID *)(pIVar31 + 0x38);
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 0x100;
          (pIVar24->NextWindowData).ViewportId = IVar48;
        }
        SetNextWindowClass((ImGuiWindowClass *)(this + 100));
        ImFormatString(local_a8,0x14,"##DockNode_%02X",(ulong)*(uint *)this);
        local_118.Min.x = 0.0;
        local_118.Min.y = 0.0;
        PushStyleVar(2,&local_118.Min);
        pIVar49 = (ImGuiWindow *)0x0;
        Begin(local_a8,(bool *)0x0,0x20081139);
        PopStyleVar(1);
        pIVar30 = pIVar23->CurrentWindow;
        pIVar12 = *(ImGuiWindow **)(this + 0x80);
        if ((pIVar12 != pIVar30 && pIVar12 != (ImGuiWindow *)0x0) &&
           (pIVar12->DockNodeAsHost == (ImGuiDockNode *)this)) {
          pIVar12->DockNodeAsHost = (ImGuiDockNode *)0x0;
        }
        pIVar30->DockNodeAsHost = (ImGuiDockNode *)this;
        *(ImGuiWindow **)(this + 0x80) = pIVar30;
        IVar32 = pIVar30->Pos;
        (pIVar30->DC).CursorPos = IVar32;
        *(ImVec2 *)(this + 0x48) = IVar32;
        IVar32 = pIVar30->Size;
        *(ImVec2 *)(this + 0x50) = IVar32;
        if ((*(ImGuiWindow **)(this + 0x80))->Appearing == true) {
          BringWindowToDisplayFront(*(ImGuiWindow **)(this + 0x80));
          IVar32 = extraout_RAX;
        }
        *(ushort *)(this + 0xbc) = *(ushort *)(this + 0xbc) & 0xfe00;
        local_100 = CONCAT71(IVar32._1_7_,1);
      }
    }
    else {
      pIVar30 = *(ImGuiWindow **)(*(long *)(this + 0x18) + 0x80);
      *(ImGuiWindow **)(this + 0x80) = pIVar30;
      *(ushort *)(this + 0xbc) = *(ushort *)(this + 0xbc) & 0xfe00;
      local_100 = 0;
    }
    if ((((byte)this[0xbe] & 1) != 0) &&
       (pIVar49 = *(ImGuiWindow **)(this + 0x80), pIVar49 != (ImGuiWindow *)0x0)) {
      DockNodeStartMouseMovingWindow((ImGuiDockNode *)this,pIVar49);
    }
  }
  else {
    pIVar30 = *(ImGuiWindow **)(this + 0x80);
    if (pIVar30 == (ImGuiWindow *)0x0) {
      __assert_fail("node->HostWindow",
                    "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                    ,0x36ce,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
    }
    local_100 = 0;
  }
  if ((*(long *)(this + 0x20) != 0) && (*(long *)(this + 0x40) != 0)) {
    __assert_fail("node->TabBar == __null",
                  "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                  ,0x3717,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
  }
  if (*(long *)(this + 0x18) == 0) {
    if (pIVar23->NavWindow != (ImGuiWindow *)0x0) {
      pIVar12 = pIVar23->NavWindow->RootWindow;
      pIVar51 = pIVar12->DockNode;
      if ((pIVar51 != (ImGuiDockNode *)0x0) && (pIVar12->ParentWindow == pIVar30)) {
        *(ImGuiID *)(this + 0xb0) = pIVar51->ID;
      }
    }
    if (pIVar30 == (ImGuiWindow *)0x0) {
      pIVar51 = (ImGuiDockNode *)0x0;
      goto LAB_0014052e;
    }
    uVar44 = uVar6 >> 3 & 1;
    cVar43 = (char)uVar44;
    if (uVar44 == 0) {
      local_168 = *(long *)(this + 0x90);
LAB_00140b5d:
      pIVar24 = GImGui;
      pIVar51 = (ImGuiDockNode *)CONCAT71((int7)((ulong)pIVar49 >> 8),1);
      if ((local_168 != 0 & (byte)uVar6 >> 3) == 1) {
        bVar45 = false;
        if ((*(long *)(local_168 + 0x20) != 0) || (*(int *)(local_168 + 0x30) != 0))
        goto LAB_0014053b;
        if ((GImGui->DragDropActive == true) && ((GImGui->DragDropPayload).DataFrameCount != -1)) {
          pIVar51 = (ImGuiDockNode *)(GImGui->DragDropPayload).DataType;
          iVar47 = strcmp("_IMWINDOW",(char *)pIVar51);
          if (iVar47 != 0) goto LAB_00140be3;
          pIVar49 = *(pIVar24->DragDropPayload).Data;
          bVar45 = DockNodeIsDropAllowed(pIVar30,pIVar49);
          pIVar51 = (ImGuiDockNode *)CONCAT71((int7)((ulong)pIVar49 >> 8),1);
          if (!bVar45) goto LAB_00140be3;
        }
        else {
LAB_00140be3:
          lVar40 = local_168;
          if (((byte)this[0x11] & 4) == 0) {
            __assert_fail("node->IsDockSpace()",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.cpp"
                          ,0x3732,"void ImGui::DockNodeUpdate(ImGuiDockNode *)");
          }
          do {
            lVar52 = lVar40;
            lVar40 = *(long *)(lVar52 + 0x18);
          } while (*(long *)(lVar52 + 0x18) != 0);
          local_a8._0_4_ = *(float *)(local_168 + 0x48);
          local_a8._4_4_ = *(float *)(local_168 + 0x4c);
          fVar55 = (float)*(undefined8 *)(local_168 + 0x50) + (float)local_a8._0_4_;
          fVar56 = (float)((ulong)*(undefined8 *)(local_168 + 0x50) >> 0x20) + (float)local_a8._4_4_
          ;
          if (*(float *)(lVar52 + 0x48) < (float)local_a8._0_4_) {
            local_a8._0_4_ = (float)local_a8._0_4_ + 4.0;
          }
          if (fVar55 < *(float *)(lVar52 + 0x50) + *(float *)(lVar52 + 0x48)) {
            fVar55 = fVar55 + -4.0;
          }
          if (*(float *)(lVar52 + 0x4c) < (float)local_a8._4_4_) {
            local_a8._4_4_ = (float)local_a8._4_4_ + 4.0;
          }
          if (fVar56 < *(float *)(lVar52 + 0x54) + *(float *)(lVar52 + 0x4c)) {
            fVar56 = fVar56 + -4.0;
          }
          uStack_a0 = (ImGuiDockNode *)CONCAT44(fVar56,fVar55);
          if (((float)local_a8._0_4_ <= fVar55) && ((float)local_a8._4_4_ <= fVar56)) {
            local_118.Min.y = fVar56 - (float)local_a8._4_4_;
            local_118.Min.x = fVar55 - (float)local_a8._0_4_;
            pIVar51 = (ImGuiDockNode *)local_a8;
            SetWindowHitTestHole(pIVar30,(ImVec2 *)pIVar51,&local_118.Min);
            local_118.Min.y = (float)((ulong)uStack_a0 >> 0x20) - local_a8._4_4_;
            local_118.Min.x = SUB84(uStack_a0,0) - local_a8._0_4_;
            SetWindowHitTestHole(pIVar30->ParentWindow,(ImVec2 *)pIVar51,&local_118.Min);
          }
          pIVar51 = (ImGuiDockNode *)CONCAT71((int7)((ulong)pIVar51 >> 8),1);
        }
        bVar45 = true;
        goto LAB_0014053b;
      }
      goto LAB_00140538;
    }
    ImDrawListSplitter::Split(&pIVar30->DrawList->_Splitter,pIVar30->DrawList,2);
    pIVar49 = (ImGuiWindow *)pIVar30->DrawList;
    ImDrawListSplitter::SetCurrentChannel
              ((ImDrawListSplitter *)&(pIVar49->ScrollTarget).y,(ImDrawList *)pIVar49,1);
    local_168 = *(long *)(this + 0x90);
    if (*(long *)(this + 0x18) == 0) goto LAB_00140b5d;
    bVar45 = false;
    pIVar51 = (ImGuiDockNode *)CONCAT71((int7)((ulong)pIVar49 >> 8),1);
    cVar43 = '\x01';
  }
  else {
    pIVar51 = (ImGuiDockNode *)CONCAT71((int7)((ulong)pIVar49 >> 8),pIVar30 != (ImGuiWindow *)0x0);
LAB_0014052e:
    local_168 = *(long *)(this + 0x90);
    cVar43 = '\0';
LAB_00140538:
    bVar45 = false;
  }
LAB_0014053b:
  if ((*(long *)(this + 0x18) == 0) && ((char)pIVar51 != '\0')) {
    pIVar51 = (ImGuiDockNode *)((ulong)pIVar51 & 0xffffffff);
    DockNodeTreeUpdatePosSize((ImGuiDockNode *)this,pIVar30->Pos,pIVar30->Size,false);
    DockNodeTreeUpdateSplitter((ImGuiDockNode *)this);
  }
  if (((((char)pIVar51 != '\0') && (*(long *)(this + 0x20) == 0)) && (*(int *)(this + 0x30) == 0))
     && (((uVar6 & 8) == 0 & (byte)this[0xbd] >> 1) == 1)) {
    pIVar11 = pIVar30->DrawList;
    local_118.Min.y =
         (float)((ulong)*(undefined8 *)(this + 0x50) >> 0x20) +
         (float)((ulong)*(undefined8 *)(this + 0x48) >> 0x20);
    local_118.Min.x = (float)*(undefined8 *)(this + 0x50) + (float)*(undefined8 *)(this + 0x48);
    local_a8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 0x27);
    uVar16 = (GImGui->Style).Colors[0x27].z;
    uVar17 = (GImGui->Style).Colors[0x27].w;
    uStack_a0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar17,uVar16);
    pIVar51 = (ImGuiDockNode *)((ulong)pIVar51 & 0xffffffff);
    IVar28 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
    ImDrawList::AddRectFilled(pIVar11,(ImVec2 *)(this + 0x48),&local_118.Min,IVar28,0.0,0);
  }
  if ((cVar43 != '\0') && (((byte)this[0xbd] & 2) != 0)) {
    pIVar51 = (ImGuiDockNode *)((ulong)pIVar51 & 0xffffffff);
    ImDrawListSplitter::SetCurrentChannel(&pIVar30->DrawList->_Splitter,pIVar30->DrawList,0);
    pIVar11 = pIVar30->DrawList;
    if (bVar45) {
      IVar32 = *(ImVec2 *)(this + 0x48);
      outer.Max.x = (float)*(undefined8 *)(this + 0x50) + IVar32.x;
      outer.Max.y = (float)((ulong)*(undefined8 *)(this + 0x50) >> 0x20) + IVar32.y;
      local_e8 = *(ImVec2 *)(local_168 + 0x48);
      uStack_e0 = 0;
      inner.Max.y = (float)((ulong)*(undefined8 *)(local_168 + 0x50) >> 0x20) + local_e8.y;
      inner.Max.x = (float)*(undefined8 *)(local_168 + 0x50) + local_e8.x;
      local_a8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar18 = (GImGui->Style).Colors[2].z;
      uVar19 = (GImGui->Style).Colors[2].w;
      uStack_a0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar19,uVar18);
      IVar28 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      outer.Min = IVar32;
      inner.Min = local_e8;
      RenderRectFilledWithHole(pIVar11,outer,inner,IVar28,0.0);
    }
    else {
      local_118.Min.y =
           (float)((ulong)*(undefined8 *)(this + 0x50) >> 0x20) +
           (float)((ulong)*(undefined8 *)(this + 0x48) >> 0x20);
      local_118.Min.x = (float)*(undefined8 *)(this + 0x50) + (float)*(undefined8 *)(this + 0x48);
      local_a8 = *(undefined1 (*) [8])((GImGui->Style).Colors + 2);
      uVar20 = (GImGui->Style).Colors[2].z;
      uVar21 = (GImGui->Style).Colors[2].w;
      uStack_a0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * (float)uVar21,uVar20);
      IVar28 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      ImDrawList::AddRectFilled(pIVar11,(ImVec2 *)(this + 0x48),&local_118.Min,IVar28,0.0,0);
    }
    ImDrawListSplitter::Merge(&pIVar30->DrawList->_Splitter,pIVar30->DrawList);
  }
  pIVar24 = GImGui;
  if ((char)pIVar51 == '\0') {
    uVar54 = *(ushort *)(this + 0xbc);
LAB_00140899:
    *(undefined4 *)(this + 0xb8) = 0;
    *(ushort *)(this + 0xbc) = uVar54 & 0xbbff;
LAB_001408b2:
    if ((*(long *)(this + 0x40) == 0) ||
       (iVar47 = *(int *)(*(long *)(this + 0x40) + 0x18), iVar47 == 0)) goto LAB_001408c2;
  }
  else {
    uVar54 = *(ushort *)(this + 0xbc);
    if (*(int *)(this + 0x30) < 1) goto LAB_00140899;
    iVar47 = *(int *)(this + 0xb8);
    iVar7 = GImGui->FrameCount;
    *(ushort *)(this + 0xbc) = uVar54 & 0xbfff;
    *(undefined4 *)(this + 0xb8) = 0;
    pIVar31 = this;
    do {
      pIVar53 = pIVar31;
      pIVar31 = *(ImGui **)(pIVar53 + 0x18);
    } while (*(ImGui **)(pIVar53 + 0x18) != (ImGui *)0x0);
    iVar38 = *(int *)(this + 0xa8) + 1;
    if (pIVar24->NavWindowingTarget == (ImGuiWindow *)0x0) {
      if ((pIVar24->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar24->NavWindow->RootWindowForTitleBarHighlight == pIVar30->RootWindowDockTree)) {
        bVar45 = *(int *)(pIVar53 + 0xb0) == *(int *)this;
        goto LAB_00140888;
      }
      local_178 = 0;
    }
    else {
      bVar45 = pIVar24->NavWindowingTarget->DockNode == (ImGuiDockNode *)this;
LAB_00140888:
      local_178 = (uint)bVar45;
    }
    if ((*(uint *)(this + 0x10) & 0x3000) == 0) {
      local_ec = (uint)pIVar51;
      bVar45 = pIVar30->SkipItems;
      if ((*(uint *)(this + 0x10) >> 10 & 1) == 0) {
        pIVar30->SkipItems = false;
        (pIVar30->DC).NavLayerCurrent = ImGuiNavLayer_Menu;
      }
      PushOverrideID(*(ImGuiID *)this);
      IVar32 = *(ImVec2 *)(this + 0x40);
      local_e8 = IVar32;
      if (IVar32 == (ImVec2)0x0) {
        DockNodeAddTabBar((ImGuiDockNode *)this);
        IVar32 = *(ImVec2 *)(this + 0x40);
      }
      *(ushort *)(this + 0xbc) =
           (ushort)*(undefined4 *)(this + 0xbc) & 0xfbff | (ushort)(local_178 << 10);
      local_f8 = (ImRect *)CONCAT71(local_f8._1_7_,iVar47 != 0);
      local_c0 = pIVar53;
      if ((((byte)this[0x11] & 0x40) == 0) && ((pIVar24->Style).WindowMenuButtonPosition != -1)) {
        IVar48 = 0;
        IVar29 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
        bVar26 = IsPopupOpen(IVar29,0);
        pIVar25 = GImGui;
        if (bVar26) {
          IVar48 = 0;
          fVar55 = *(float *)(this + 0x48);
          if ((GImGui->Style).WindowMenuButtonPosition == 0) {
            fVar56 = 0.0;
          }
          else {
            fVar55 = fVar55 + *(float *)(this + 0x50);
            fVar56 = 1.0;
          }
          fVar2 = (GImGui->Style).FramePadding.y;
          fVar3 = GImGui->FontSize;
          fVar4 = *(float *)(this + 0x4c);
          (GImGui->NextWindowData).Flags = (GImGui->NextWindowData).Flags | 1;
          (pIVar25->NextWindowData).PosVal.x = fVar55;
          (pIVar25->NextWindowData).PosVal.y = fVar2 + fVar2 + fVar3 + fVar4;
          (pIVar25->NextWindowData).PosPivotVal.x = fVar56;
          (pIVar25->NextWindowData).PosPivotVal.y = 0.0;
          (pIVar25->NextWindowData).PosCond = 1;
          (pIVar25->NextWindowData).PosUndock = true;
          bVar26 = BeginPopup("#WindowMenu",0);
          if (bVar26) {
            this[0xbd] = (ImGui)((byte)this[0xbd] | 4);
            iVar47 = *(int *)IVar32;
            if (iVar47 == 1) {
              bVar26 = MenuItem("Hide tab bar",(char *)0x0,
                                (bool)((byte)(*(uint *)(this + 0x10) >> 0xd) & 1),true);
              if (bVar26) {
                this[0xbe] = (ImGui)((byte)this[0xbe] | 4);
              }
            }
            else if (0 < iVar47) {
              lVar40 = 0;
              lVar52 = 0;
              IVar48 = 0;
              do {
                if ((*(byte *)((long)&(*(ImGuiTabItem **)((long)IVar32 + 8))->Flags + lVar40 + 2) &
                    0x20) == 0) {
                  pIVar33 = (ImGuiTabItem *)
                            ((long)&(*(ImGuiTabItem **)((long)IVar32 + 8))->ID + lVar40);
                  pcVar36 = ImGuiTabBar::GetTabName((ImGuiTabBar *)IVar32,pIVar33);
                  local_a8._0_4_ = 0.0;
                  local_a8._4_4_ = 0.0;
                  bVar26 = Selectable(pcVar36,pIVar33->ID == *(ImGuiID *)((long)IVar32 + 0x18),0,
                                      (ImVec2 *)local_a8);
                  pIVar25 = GImGui;
                  if (bVar26) {
                    IVar48 = pIVar33->ID;
                  }
                  pIVar49 = GImGui->CurrentWindow;
                  pIVar49->WriteAccessed = true;
                  if (pIVar49->SkipItems == false) {
                    (pIVar49->DC).CursorPos.x =
                         (pIVar25->Style).ItemSpacing.x + (pIVar49->DC).CursorPosPrevLine.x;
                    (pIVar49->DC).CursorPos.y = (pIVar49->DC).CursorPosPrevLine.y;
                    (pIVar49->DC).CurrLineSize = (pIVar49->DC).PrevLineSize;
                    (pIVar49->DC).CurrLineTextBaseOffset = (pIVar49->DC).PrevLineTextBaseOffset;
                  }
                  Text("   ");
                  iVar47 = *(int *)IVar32;
                }
                lVar52 = lVar52 + 1;
                lVar40 = lVar40 + 0x30;
              } while (lVar52 < iVar47);
              EndPopup();
              if (IVar48 == 0) {
                IVar48 = 0;
              }
              else {
                *(ImGuiID *)((long)IVar32 + 0x1c) = IVar48;
              }
              goto LAB_00140ef5;
            }
            EndPopup();
          }
LAB_00140ef5:
          local_178 = (uint)(byte)((byte)local_178 | ((byte)this[0xbd] & 4) >> 2);
        }
        bVar26 = true;
      }
      else {
        bVar26 = false;
        IVar48 = 0;
      }
      local_118.Min.x = 0.0;
      local_118.Min.y = 0.0;
      local_118.Max.x = 0.0;
      local_118.Max.y = 0.0;
      local_48.Min.x = 0.0;
      local_48.Min.y = 0.0;
      local_48.Max.x = 0.0;
      local_48.Max.y = 0.0;
      local_b0.x = 0.0;
      local_b0.y = 0.0;
      local_b8.x = 0.0;
      local_b8.y = 0.0;
      DockNodeCalcTabBarLayout((ImGuiDockNode *)this,&local_118,&local_48,&local_b0,&local_b8);
      iVar47 = *(int *)IVar32;
      if (0 < *(int *)(this + 0x30)) {
        lVar40 = 0;
        do {
          pIVar49 = *(ImGuiWindow **)(*(long *)(this + 0x38) + lVar40 * 8);
          pIVar33 = TabBarFindTabByID((ImGuiTabBar *)IVar32,pIVar49->ID);
          if (pIVar33 == (ImGuiTabItem *)0x0) {
            TabBarAddTab((ImGuiTabBar *)IVar32,0x400000,pIVar49);
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 < *(int *)(this + 0x30));
      }
      iVar34 = 10;
      if ((char)local_178 != '\0') {
        *(int *)(this + 0xac) = pIVar24->FrameCount;
        iVar34 = 0xb;
      }
      iVar39 = 0xc;
      if (pIVar30->Collapsed == false) {
        iVar39 = iVar34;
      }
      pIVar41 = (ImVec2 *)((long)&(GImGui->Style).Colors[0].x + (ulong)(uint)(iVar39 << 4));
      local_a8 = *(undefined1 (*) [8])pIVar41;
      IVar22 = pIVar41[1];
      uStack_a0._4_4_ = IVar22.y;
      uStack_a0 = (ImGuiDockNode *)CONCAT44((GImGui->Style).Alpha * uStack_a0._4_4_,IVar22.x);
      IVar28 = ColorConvertFloat4ToU32((ImVec4 *)local_a8);
      ImDrawList::AddRectFilled
                (pIVar30->DrawList,&local_118.Min,&local_118.Max,IVar28,pIVar30->WindowRounding,0x30
                );
      if (bVar26) {
        IVar29 = ImGuiWindow::GetID(pIVar30,"#COLLAPSE",(char *)0x0);
        bVar26 = CollapseButton(IVar29,&local_b0,(ImGuiDockNode *)this);
        if (bVar26) {
          IVar29 = ImGuiWindow::GetID(GImGui->CurrentWindow,"#WindowMenu",(char *)0x0);
          OpenPopupEx(IVar29,0);
        }
        if ((GImGui->ActiveId != 0) && (GImGui->ActiveId == (GImGui->LastItemData).ID)) {
          IVar48 = *(ImGuiID *)((long)IVar32 + 0x18);
        }
      }
      uVar6 = *(uint *)IVar32;
      uVar35 = (ulong)(int)uVar6;
      if (0 < (long)uVar35) {
        lVar40 = uVar35 * 0x30 + -0x2c;
        do {
          if ((long)*(int *)IVar32 < (long)uVar35) {
            pcVar36 = "T &ImVector<ImGuiTabItem>::operator[](int) [T = ImGuiTabItem]";
            goto LAB_00141773;
          }
          pIVar33 = *(ImGuiTabItem **)((long)IVar32 + 8);
          uVar44 = *(uint *)((long)&pIVar33->ID + lVar40);
          if ((uVar44 >> 0x16 & 1) == 0) goto LAB_001410de;
          *(uint *)((long)&pIVar33->ID + lVar40) = uVar44 & 0xffbfffff;
          lVar40 = lVar40 + -0x30;
          bVar26 = 1 < uVar35;
          uVar35 = uVar35 - 1;
        } while (bVar26);
        uVar35 = 0;
LAB_001410de:
        iVar34 = (int)uVar35;
        if ((iVar34 < (int)uVar6) && (iVar34 + 1U < uVar6)) {
          qsort(pIVar33 + (uVar35 & 0xffffffff),(long)(int)(uVar6 - iVar34),0x30,
                TabItemComparerByDockOrder);
        }
      }
      if ((pIVar24->NavWindow != (ImGuiWindow *)0x0) &&
         (pIVar49 = pIVar24->NavWindow->RootWindow, pIVar49->DockNode == (ImGuiDockNode *)this)) {
        *(ImGuiID *)((long)IVar32 + 0x18) = pIVar49->ID;
      }
      if ((local_e8 == (ImVec2)0x0) &&
         (pIVar33 = TabBarFindTabByID((ImGuiTabBar *)IVar32,*(ImGuiID *)(this + 0xb4)),
         pIVar33 != (ImGuiTabItem *)0x0)) {
        pIVar31 = this + 0xb4;
LAB_0014118e:
        IVar29 = *(ImGuiID *)pIVar31;
        *(ImGuiID *)((long)IVar32 + 0x1c) = IVar29;
        *(ImGuiID *)((long)IVar32 + 0x18) = IVar29;
      }
      else {
        uVar6 = *(uint *)IVar32;
        if (iVar47 < (int)uVar6) {
          if ((int)uVar6 < 1) {
            __assert_fail("Size > 0",
                          "/workspace/llm4binary/github/license_c_cmakelists/binji[P]binjgb/third_party/imgui/imgui.h"
                          ,0x70f,"T &ImVector<ImGuiTabItem>::back() [T = ImGuiTabItem]");
          }
          pIVar31 = (ImGui *)&((*(ImGuiTabItem **)((long)IVar32 + 8))[(ulong)uVar6 - 1].Window)->ID;
          goto LAB_0014118e;
        }
      }
      local_e8.x = (float)(uint)((byte)local_f8 & iVar38 == iVar7);
      uVar6 = local_178 << 0x15 | 0x500003;
      if (pIVar30->Collapsed != false) {
        uVar6 = 0x500003;
      }
      BeginTabBarEx((ImGuiTabBar *)IVar32,&local_48,uVar6,(ImGuiDockNode *)this);
      local_58.x = 0.0;
      local_58.y = 0.0;
      IStack_50.x = 0.0;
      IStack_50.y = 0.0;
      local_68 = (ImGuiTabBar *)0x0;
      IStack_60.x = 0.0;
      IStack_60.y = 0.0;
      local_78.Size = 0;
      local_78.Capacity = 0;
      local_78.Data = (ImGuiWindow **)0x0;
      local_88 = (ImGuiDockNode *)0x0;
      pIStack_80 = (ImGuiDockNode *)0x0;
      local_98._0_4_ = 0;
      local_98._4_4_ = ImGuiDockNodeState_Unknown;
      pIStack_90 = (ImGuiDockNode *)0x0;
      local_a8._0_4_ = 0.0;
      local_a8._4_4_ = 0.0;
      uStack_a0 = (ImGuiDockNode *)0x0;
      lVar40 = 0;
      do {
        pIVar42 = (pIVar24->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar40);
        uVar13 = *(undefined8 *)&pIVar42->z;
        *(undefined8 *)(local_a8 + lVar40 * 4) = *(undefined8 *)pIVar42;
        *(undefined8 *)((long)&uStack_a0 + lVar40 * 4) = uVar13;
        lVar40 = lVar40 + 4;
      } while (lVar40 != 0x18);
      *(undefined8 *)(this + 0x88) = 0;
      iVar47 = *(int *)(this + 0x30);
      if (0 < iVar47) {
        local_f8 = &(pIVar24->LastItemData).Rect;
        lVar40 = 0;
        do {
          pIVar49 = *(ImGuiWindow **)(*(long *)(this + 0x38) + lVar40 * 8);
          if (((((((byte)(uVar54 >> 0xe) & iVar38 == iVar7) == 0) &&
                ((float)pIVar49->ID != local_e8.x)) || (pIVar49->HasCloseButton != true)) ||
              ((pIVar49->Flags & 0x100000) != 0)) &&
             (pIVar24->FrameCount <= pIVar49->LastFrameActive + 1 || iVar38 != iVar7)) {
            uVar6 = pIVar49->Flags;
            uVar44 = (pIVar49->WindowClass).TabItemFlagsOverrideSet;
            uVar8 = *(ImGuiTabBarFlags *)((long)IVar32 + 0x10);
            lVar52 = 0;
            do {
              uVar9 = *(uint *)((long)(pIVar49->DockStyle).Colors + lVar52);
              pIVar42 = (pIVar24->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar52);
              pIVar42->x = (float)(uVar9 & 0xff) * 0.003921569;
              pIVar42->y = (float)(uVar9 >> 8 & 0xff) * 0.003921569;
              pIVar42->z = (float)(uVar9 >> 0x10 & 0xff) * 0.003921569;
              pIVar42->w = (float)(uVar9 >> 0x18) * 0.003921569;
              lVar52 = lVar52 + 4;
            } while (lVar52 != 0x18);
            local_d0.x = (float)CONCAT31(local_d0.x._1_3_,1);
            pIVar42 = (ImVec4 *)0x0;
            if (pIVar49->HasCloseButton != false) {
              pIVar42 = &local_d0;
            }
            TabItemEx((ImGuiTabBar *)IVar32,pIVar49->Name,(bool *)pIVar42,
                      uVar8 >> 1 & 4 | uVar6 >> 0x14 & 1 | uVar44,pIVar49);
            IVar29 = pIVar49->ID;
            if (local_d0.x._0_1_ == '\0') {
              *(ImGuiID *)(this + 0xb8) = IVar29;
            }
            if (*(ImGuiID *)((long)IVar32 + 0x20) == IVar29) {
              *(ImGuiWindow **)(this + 0x88) = pIVar49;
            }
            pIVar49->DockTabItemStatusFlags = (pIVar24->LastItemData).StatusFlags;
            IVar22 = local_f8->Max;
            (pIVar49->DockTabItemRect).Min = local_f8->Min;
            (pIVar49->DockTabItemRect).Max = IVar22;
            if (((pIVar24->NavWindow != (ImGuiWindow *)0x0) &&
                (pIVar24->NavWindow->RootWindow == pIVar49)) &&
               (((pIVar49->DC).NavLayersActiveMask & 2) == 0)) {
              pIVar30->NavLastIds[1] = IVar29;
            }
            iVar47 = *(int *)(this + 0x30);
          }
          lVar40 = lVar40 + 1;
        } while (lVar40 < iVar47);
      }
      lVar40 = 0;
      do {
        uVar13 = *(undefined8 *)(local_a8 + lVar40 * 4);
        uVar14 = *(undefined8 *)((long)&uStack_a0 + lVar40 * 4);
        pIVar42 = (pIVar24->Style).Colors + *(int *)((long)GWindowDockStyleColors + lVar40);
        pIVar42->x = (float)(int)uVar13;
        pIVar42->y = (float)(int)((ulong)uVar13 >> 0x20);
        pIVar42->z = (float)(int)uVar14;
        pIVar42->w = (float)(int)((ulong)uVar14 >> 0x20);
        lVar40 = lVar40 + 4;
      } while (lVar40 != 0x18);
      if ((*(long *)(this + 0x88) != 0) &&
         (((char)local_178 != '\0' || (*(long *)(local_c0 + 0x88) == 0)))) {
        *(long *)(local_c0 + 0x88) = *(long *)(this + 0x88);
      }
      if (((byte)this[0xbd] & 8) != 0) {
        if ((*(long *)(this + 0x88) == 0) ||
           (bVar26 = true, *(char *)(*(long *)(this + 0x88) + 0xd0) == '\0')) {
          PushItemFlag(4,true);
          local_d0.w = (pIVar24->Style).Colors[0].w * 0.4;
          local_d0.x = (pIVar24->Style).Colors[0].x;
          local_d0.y = (pIVar24->Style).Colors[0].y;
          local_d0.z = (pIVar24->Style).Colors[0].z;
          bVar26 = false;
          PushStyleColor(0,&local_d0);
        }
        IVar29 = ImGuiWindow::GetID(pIVar30,"#CLOSE",(char *)0x0);
        bVar27 = CloseButton(IVar29,&local_b8);
        if ((bVar27) && (this[0xbd] = (ImGui)((byte)this[0xbd] | 0x40), 0 < *(int *)IVar32)) {
          lVar40 = 0;
          lVar52 = 0;
          do {
            TabBarCloseTab((ImGuiTabBar *)IVar32,
                           (ImGuiTabItem *)
                           ((long)&(*(ImGuiTabItem **)((long)IVar32 + 8))->ID + lVar40));
            lVar52 = lVar52 + 1;
            lVar40 = lVar40 + 0x30;
          } while (lVar52 < *(int *)IVar32);
        }
        if (!bVar26) {
          PopStyleColor(1);
          PopItemFlag();
        }
      }
      IVar29 = ImGuiWindow::GetID(pIVar30,"#TITLEBAR",(char *)0x0);
      if (((pIVar24->HoveredId == 0) || (pIVar24->HoveredId == IVar29)) ||
         (pIVar24->ActiveId == IVar29)) {
        ButtonBehavior(&local_118,IVar29,(bool *)0x0,(bool *)&local_d0,0x1000);
        if (pIVar24->HoveredId == IVar29) {
          (pIVar24->LastItemData).ID = IVar29;
          pIVar24 = GImGui;
          IVar29 = (GImGui->LastItemData).ID;
          if (GImGui->HoveredId == IVar29) {
            GImGui->HoveredIdAllowOverlap = true;
          }
          if (pIVar24->ActiveId == IVar29) {
            pIVar24->ActiveIdAllowOverlap = true;
          }
        }
        if (local_d0.x._0_1_ == '\x01') {
          pfVar1 = (GImGui->IO).MouseDownDuration;
          IVar29 = *(ImGuiID *)((long)IVar32 + 0x18);
          if (*pfVar1 != 0.0) {
            IVar29 = IVar48;
          }
          if (NAN(*pfVar1)) {
            IVar29 = IVar48;
          }
          pIVar33 = TabBarFindTabByID((ImGuiTabBar *)IVar32,*(ImGuiID *)((long)IVar32 + 0x18));
          IVar48 = IVar29;
          if (pIVar33 != (ImGuiTabItem *)0x0) {
            pIVar49 = pIVar33->Window;
            if (pIVar49 == (ImGuiWindow *)0x0) {
              pIVar49 = *(ImGuiWindow **)(this + 0x80);
            }
            StartMouseMovingWindowOrNode(pIVar49,(ImGuiDockNode *)this,false);
          }
        }
      }
      if (*(ImGuiID *)((long)IVar32 + 0x1c) != 0) {
        IVar48 = *(ImGuiID *)((long)IVar32 + 0x1c);
      }
      if (((IVar48 != 0) &&
          (pIVar33 = TabBarFindTabByID((ImGuiTabBar *)IVar32,IVar48), pIVar33 != (ImGuiTabItem *)0x0
          )) && (pIVar33->Window != (ImGuiWindow *)0x0)) {
        FocusWindow(pIVar33->Window);
        NavInitWindow(pIVar33->Window,false);
      }
      EndTabBar();
      PopID();
      if (((byte)this[0x11] & 4) == 0) {
        (pIVar30->DC).NavLayerCurrent = ImGuiNavLayer_Main;
        pIVar30->SkipItems = bVar45;
      }
      pIVar51 = (ImGuiDockNode *)(ulong)local_ec;
      goto LAB_001408b2;
    }
    lVar40 = **(long **)(this + 0x38);
    *(long *)(this + 0x88) = lVar40;
    *(ushort *)(this + 0xbc) = uVar54 & 0xbbff | (ushort)(local_178 << 10);
    if ((byte)local_178 == 0) {
      if (lVar40 != 0) {
        if (*(long *)(pIVar53 + 0x88) == 0) goto LAB_00140b23;
        goto LAB_00140b2a;
      }
      goto LAB_001408b2;
    }
    *(int *)(this + 0xac) = pIVar24->FrameCount;
    if (lVar40 == 0) goto LAB_001408b2;
LAB_00140b23:
    *(long *)(pIVar53 + 0x88) = lVar40;
LAB_00140b2a:
    if (*(long *)(this + 0x40) != 0) {
      *(undefined4 *)(*(long *)(this + 0x40) + 0x20) = *(undefined4 *)(*(long *)(this + 0x88) + 8);
      goto LAB_001408b2;
    }
LAB_001408c2:
    if (*(int *)(this + 0x30) < 1) goto LAB_001408d8;
    iVar47 = *(int *)(**(long **)(this + 0x38) + 8);
  }
  *(int *)(this + 0xb4) = iVar47;
LAB_001408d8:
  if ((char)pIVar51 == '\0') {
    *(int *)(this + 0xa8) = pIVar23->FrameCount;
  }
  else {
    if (((((byte)this[0xbd] & 2) != 0) && (*(long *)(this + 0x18) == 0)) &&
       ((pIVar23->MovingWindow == (ImGuiWindow *)0x0 ||
        (pIVar23->MovingWindow->RootWindowDockTree != pIVar30)))) {
      BeginDockableDragDropTarget(pIVar30);
    }
    *(int *)(this + 0xa8) = pIVar23->FrameCount;
    if (*(ImGui **)(this + 0x20) != (ImGui *)0x0) {
      DockNodeUpdate(*(ImGui **)(this + 0x20),pIVar51);
    }
    if (*(ImGui **)(this + 0x28) != (ImGui *)0x0) {
      DockNodeUpdate(*(ImGui **)(this + 0x28),pIVar51);
    }
    if (*(long *)(this + 0x18) == 0) {
      RenderWindowOuterBorders(pIVar30);
    }
  }
  if ((char)local_100 != '\0') {
    End();
  }
  return;
}

Assistant:

static void ImGui::DockNodeUpdate(ImGuiDockNode* node)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(node->LastFrameActive != g.FrameCount);
    node->LastFrameAlive = g.FrameCount;
    node->MarkedForPosSizeWrite = false;

    node->CentralNode = node->OnlyNodeWithWindows = NULL;
    if (node->IsRootNode())
        DockNodeUpdateForRootNode(node);

    // Remove tab bar if not needed
    if (node->TabBar && node->IsNoTabBar())
        DockNodeRemoveTabBar(node);

    // Early out for hidden root dock nodes (when all DockId references are in inactive windows, or there is only 1 floating window holding on the DockId)
    bool want_to_hide_host_window = false;
    if (node->IsFloatingNode())
    {
        if (node->Windows.Size <= 1 && node->IsLeafNode())
            if (!g.IO.ConfigDockingAlwaysTabBar && (node->Windows.Size == 0 || !node->Windows[0]->WindowClass.DockingAlwaysTabBar))
                want_to_hide_host_window = true;
        if (node->CountNodeWithWindows == 0)
            want_to_hide_host_window = true;
    }
    if (want_to_hide_host_window)
    {
        if (node->Windows.Size == 1)
        {
            // Floating window pos/size is authoritative
            ImGuiWindow* single_window = node->Windows[0];
            node->Pos = single_window->Pos;
            node->Size = single_window->SizeFull;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Window;

            // Transfer focus immediately so when we revert to a regular window it is immediately selected
            if (node->HostWindow && g.NavWindow == node->HostWindow)
                FocusWindow(single_window);
            if (node->HostWindow)
            {
                single_window->Viewport = node->HostWindow->Viewport;
                single_window->ViewportId = node->HostWindow->ViewportId;
                if (node->HostWindow->ViewportOwned)
                {
                    single_window->Viewport->Window = single_window;
                    single_window->ViewportOwned = true;
                }
            }
        }

        DockNodeHideHostWindow(node);
        node->State = ImGuiDockNodeState_HostWindowHiddenBecauseSingleWindow;
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->HasCloseButton = node->HasWindowMenuButton = false;
        node->LastFrameActive = g.FrameCount;

        if (node->WantMouseMove && node->Windows.Size == 1)
            DockNodeStartMouseMovingWindow(node, node->Windows[0]);
        return;
    }

    // In some circumstance we will defer creating the host window (so everything will be kept hidden),
    // while the expected visible window is resizing itself.
    // This is important for first-time (no ini settings restored) single window when io.ConfigDockingAlwaysTabBar is enabled,
    // otherwise the node ends up using the minimum window size. Effectively those windows will take an extra frame to show up:
    //   N+0: Begin(): window created (with no known size), node is created
    //   N+1: DockNodeUpdate(): node skip creating host window / Begin(): window size applied, not visible
    //   N+2: DockNodeUpdate(): node can create host window / Begin(): window becomes visible
    // We could remove this frame if we could reliably calculate the expected window size during node update, before the Begin() code.
    // It would require a generalization of CalcWindowExpectedSize(), probably extracting code away from Begin().
    // In reality it isn't very important as user quickly ends up with size data in .ini file.
    if (node->IsVisible && node->HostWindow == NULL && node->IsFloatingNode() && node->IsLeafNode())
    {
        IM_ASSERT(node->Windows.Size > 0);
        ImGuiWindow* ref_window = NULL;
        if (node->SelectedTabId != 0) // Note that we prune single-window-node settings on .ini loading, so this is generally 0 for them!
            ref_window = DockNodeFindWindowByID(node, node->SelectedTabId);
        if (ref_window == NULL)
            ref_window = node->Windows[0];
        if (ref_window->AutoFitFramesX > 0 || ref_window->AutoFitFramesY > 0)
        {
            node->State = ImGuiDockNodeState_HostWindowHiddenBecauseWindowsAreResizing;
            return;
        }
    }

    const ImGuiDockNodeFlags node_flags = node->MergedFlags;

    // Decide if the node will have a close button and a window menu button
    node->HasWindowMenuButton = (node->Windows.Size > 0) && (node_flags & ImGuiDockNodeFlags_NoWindowMenuButton) == 0;
    node->HasCloseButton = false;
    for (int window_n = 0; window_n < node->Windows.Size; window_n++)
    {
        // FIXME-DOCK: Setting DockIsActive here means that for single active window in a leaf node, DockIsActive will be cleared until the next Begin() call.
        ImGuiWindow* window = node->Windows[window_n];
        node->HasCloseButton |= window->HasCloseButton;
        window->DockIsActive = (node->Windows.Size > 1);
    }
    if (node_flags & ImGuiDockNodeFlags_NoCloseButton)
        node->HasCloseButton = false;

    // Bind or create host window
    ImGuiWindow* host_window = NULL;
    bool beginned_into_host_window = false;
    if (node->IsDockSpace())
    {
        // [Explicit root dockspace node]
        IM_ASSERT(node->HostWindow);
        host_window = node->HostWindow;
    }
    else
    {
        // [Automatic root or child nodes]
        if (node->IsRootNode() && node->IsVisible)
        {
            ImGuiWindow* ref_window = (node->Windows.Size > 0) ? node->Windows[0] : NULL;

            // Sync Pos
            if (node->AuthorityForPos == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowPos(ref_window->Pos);
            else if (node->AuthorityForPos == ImGuiDataAuthority_DockNode)
                SetNextWindowPos(node->Pos);

            // Sync Size
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowSize(ref_window->SizeFull);
            else if (node->AuthorityForSize == ImGuiDataAuthority_DockNode)
                SetNextWindowSize(node->Size);

            // Sync Collapsed
            if (node->AuthorityForSize == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowCollapsed(ref_window->Collapsed);

            // Sync Viewport
            if (node->AuthorityForViewport == ImGuiDataAuthority_Window && ref_window)
                SetNextWindowViewport(ref_window->ViewportId);

            SetNextWindowClass(&node->WindowClass);

            // Begin into the host window
            char window_label[20];
            DockNodeGetHostWindowTitle(node, window_label, IM_ARRAYSIZE(window_label));
            ImGuiWindowFlags window_flags = ImGuiWindowFlags_NoScrollbar | ImGuiWindowFlags_NoScrollWithMouse | ImGuiWindowFlags_DockNodeHost;
            window_flags |= ImGuiWindowFlags_NoFocusOnAppearing;
            window_flags |= ImGuiWindowFlags_NoSavedSettings | ImGuiWindowFlags_NoNavFocus | ImGuiWindowFlags_NoCollapse;
            window_flags |= ImGuiWindowFlags_NoTitleBar;

            PushStyleVar(ImGuiStyleVar_WindowPadding, ImVec2(0, 0));
            Begin(window_label, NULL, window_flags);
            PopStyleVar();
            beginned_into_host_window = true;

            host_window = g.CurrentWindow;
            DockNodeSetupHostWindow(node, host_window);
            host_window->DC.CursorPos = host_window->Pos;
            node->Pos = host_window->Pos;
            node->Size = host_window->Size;

            // We set ImGuiWindowFlags_NoFocusOnAppearing because we don't want the host window to take full focus (e.g. steal NavWindow)
            // But we still it bring it to the front of display. There's no way to choose this precise behavior via window flags.
            // One simple case to ponder if: window A has a toggle to create windows B/C/D. Dock B/C/D together, clear the toggle and enable it again.
            // When reappearing B/C/D will request focus and be moved to the top of the display pile, but they are not linked to the dock host window
            // during the frame they appear. The dock host window would keep its old display order, and the sorting in EndFrame would move B/C/D back
            // after the dock host window, losing their top-most status.
            if (node->HostWindow->Appearing)
                BringWindowToDisplayFront(node->HostWindow);

            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        else if (node->ParentNode)
        {
            node->HostWindow = host_window = node->ParentNode->HostWindow;
            node->AuthorityForPos = node->AuthorityForSize = node->AuthorityForViewport = ImGuiDataAuthority_Auto;
        }
        if (node->WantMouseMove && node->HostWindow)
            DockNodeStartMouseMovingWindow(node, node->HostWindow);
    }

    // Update focused node (the one whose title bar is highlight) within a node tree
    if (node->IsSplitNode())
        IM_ASSERT(node->TabBar == NULL);
    if (node->IsRootNode())
        if (g.NavWindow && g.NavWindow->RootWindow->DockNode && g.NavWindow->RootWindow->ParentWindow == host_window)
            node->LastFocusedNodeId = g.NavWindow->RootWindow->DockNode->ID;

    // We need to draw a background at the root level if requested by ImGuiDockNodeFlags_PassthruCentralNode, but we will only know the correct pos/size
    // _after_ processing the resizing splitters. So we are using the DrawList channel splitting facility to submit drawing primitives out of order!
    const bool render_dockspace_bg = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0;
    if (render_dockspace_bg)
    {
        host_window->DrawList->ChannelsSplit(2);
        host_window->DrawList->ChannelsSetCurrent(1);
    }

    // Register a hit-test hole in the window unless we are currently dragging a window that is compatible with our dockspace
    ImGuiDockNode* central_node = node->CentralNode;
    const bool central_node_hole = node->IsRootNode() && host_window && (node_flags & ImGuiDockNodeFlags_PassthruCentralNode) != 0 && central_node != NULL && central_node->IsEmpty();
    bool central_node_hole_register_hit_test_hole = central_node_hole;
    if (central_node_hole)
        if (const ImGuiPayload* payload = ImGui::GetDragDropPayload())
            if (payload->IsDataType(IMGUI_PAYLOAD_TYPE_WINDOW) && DockNodeIsDropAllowed(host_window, *(ImGuiWindow**)payload->Data))
                central_node_hole_register_hit_test_hole = false;
    if (central_node_hole_register_hit_test_hole)
    {
        // We add a little padding to match the "resize from edges" behavior and allow grabbing the splitter easily.
        // (But we only add it if there's something else on the other side of the hole, otherwise for e.g. fullscreen
        // covering passthru node we'd have a gap on the edge not covered by the hole)
        IM_ASSERT(node->IsDockSpace()); // We cannot pass this flag without the DockSpace() api. Testing this because we also setup the hole in host_window->ParentNode
        ImGuiDockNode* root_node = DockNodeGetRootNode(central_node);
        ImRect root_rect(root_node->Pos, root_node->Pos + root_node->Size);
        ImRect hole_rect(central_node->Pos, central_node->Pos + central_node->Size);
        if (hole_rect.Min.x > root_rect.Min.x) { hole_rect.Min.x += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.x < root_rect.Max.x) { hole_rect.Max.x -= WINDOWS_HOVER_PADDING; }
        if (hole_rect.Min.y > root_rect.Min.y) { hole_rect.Min.y += WINDOWS_HOVER_PADDING; }
        if (hole_rect.Max.y < root_rect.Max.y) { hole_rect.Max.y -= WINDOWS_HOVER_PADDING; }
        //GetForegroundDrawList()->AddRect(hole_rect.Min, hole_rect.Max, IM_COL32(255, 0, 0, 255));
        if (central_node_hole && !hole_rect.IsInverted())
        {
            SetWindowHitTestHole(host_window, hole_rect.Min, hole_rect.Max - hole_rect.Min);
            SetWindowHitTestHole(host_window->ParentWindow, hole_rect.Min, hole_rect.Max - hole_rect.Min);
        }
    }

    // Update position/size, process and draw resizing splitters
    if (node->IsRootNode() && host_window)
    {
        DockNodeTreeUpdatePosSize(node, host_window->Pos, host_window->Size);
        DockNodeTreeUpdateSplitter(node);
    }

    // Draw empty node background (currently can only be the Central Node)
    if (host_window && node->IsEmpty() && node->IsVisible && !(node_flags & ImGuiDockNodeFlags_PassthruCentralNode))
        host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_DockingEmptyBg));

    // Draw whole dockspace background if ImGuiDockNodeFlags_PassthruCentralNode if set.
    if (render_dockspace_bg && node->IsVisible)
    {
        host_window->DrawList->ChannelsSetCurrent(0);
        if (central_node_hole)
            RenderRectFilledWithHole(host_window->DrawList, node->Rect(), central_node->Rect(), GetColorU32(ImGuiCol_WindowBg), 0.0f);
        else
            host_window->DrawList->AddRectFilled(node->Pos, node->Pos + node->Size, GetColorU32(ImGuiCol_WindowBg), 0.0f);
        host_window->DrawList->ChannelsMerge();
    }

    // Draw and populate Tab Bar
    if (host_window && node->Windows.Size > 0)
    {
        DockNodeUpdateTabBar(node, host_window);
    }
    else
    {
        node->WantCloseAll = false;
        node->WantCloseTabId = 0;
        node->IsFocused = false;
    }
    if (node->TabBar && node->TabBar->SelectedTabId)
        node->SelectedTabId = node->TabBar->SelectedTabId;
    else if (node->Windows.Size > 0)
        node->SelectedTabId = node->Windows[0]->ID;

    // Draw payload drop target
    if (host_window && node->IsVisible)
        if (node->IsRootNode() && (g.MovingWindow == NULL || g.MovingWindow->RootWindowDockTree != host_window))
            BeginDockableDragDropTarget(host_window);

    // We update this after DockNodeUpdateTabBar()
    node->LastFrameActive = g.FrameCount;

    // Recurse into children
    // FIXME-DOCK FIXME-OPT: Should not need to recurse into children
    if (host_window)
    {
        if (node->ChildNodes[0])
            DockNodeUpdate(node->ChildNodes[0]);
        if (node->ChildNodes[1])
            DockNodeUpdate(node->ChildNodes[1]);

        // Render outer borders last (after the tab bar)
        if (node->IsRootNode())
            RenderWindowOuterBorders(host_window);
    }

    // End host window
    if (beginned_into_host_window) //-V1020
        End();
}